

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

void __thiscall
doctest::anon_unknown_14::ConsoleReporter::test_case_end
          (ConsoleReporter *this,CurrentTestCaseStats *st)

{
  _func_int **pp_Var1;
  _func_int *p_Var2;
  byte bVar3;
  uint uVar4;
  ostream *poVar5;
  size_t sVar6;
  long lVar7;
  char *pcVar8;
  
  if (this->tc->m_no_output != false) {
    return;
  }
  if ((this->opt->duration != false) || (bVar3 = 0, 1 < (uint)st->failure_flags)) {
    logTestStart(this);
    bVar3 = this->opt->duration;
  }
  if ((bVar3 & 1) != 0) {
    poVar5 = this->s;
    Color::operator<<(poVar5,None);
    pp_Var1 = poVar5->_vptr_basic_ostream;
    *(undefined8 *)(&poVar5->field_0x8 + (long)pp_Var1[-3]) = 6;
    p_Var2 = pp_Var1[-3];
    *(uint *)(&poVar5->field_0x18 + (long)p_Var2) =
         *(uint *)(&poVar5->field_0x18 + (long)p_Var2) & 0xfffffefb | 4;
    poVar5 = std::ostream::_M_insert<double>(st->seconds);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," s: ",4);
    pcVar8 = this->tc->m_name;
    if (pcVar8 == (char *)0x0) {
      std::ios::clear((int)poVar5 + (int)poVar5->_vptr_basic_ostream[-3]);
    }
    else {
      sVar6 = strlen(pcVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar8,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  }
  uVar4 = st->failure_flags;
  if ((uVar4 & 0x10) != 0) {
    poVar5 = this->s;
    Color::operator<<(poVar5,Red);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"Test case exceeded time limit of ",0x21);
    pp_Var1 = poVar5->_vptr_basic_ostream;
    *(undefined8 *)(&poVar5->field_0x8 + (long)pp_Var1[-3]) = 6;
    p_Var2 = pp_Var1[-3];
    *(uint *)(&poVar5->field_0x18 + (long)p_Var2) =
         *(uint *)(&poVar5->field_0x18 + (long)p_Var2) & 0xfffffefb | 4;
    poVar5 = std::ostream::_M_insert<double>(this->tc->m_timeout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"!\n",2);
    uVar4 = st->failure_flags;
  }
  if ((uVar4 & 0x20) == 0) {
    if ((uVar4 & 0x40) == 0) {
      if ((uVar4 >> 9 & 1) == 0) {
        if ((char)uVar4 < '\0') {
          poVar5 = this->s;
          Color::operator<<(poVar5,Red);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Didn\'t fail exactly ",0x14);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->tc->m_expected_failures);
          pcVar8 = " times so marking it as failed!\n";
          lVar7 = 0x20;
        }
        else {
          if ((uVar4 >> 8 & 1) == 0) goto LAB_001148ba;
          poVar5 = this->s;
          Color::operator<<(poVar5,Yellow);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Failed exactly ",0xf);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->tc->m_expected_failures);
          pcVar8 = " times as expected so marking it as not failed!\n";
          lVar7 = 0x30;
        }
      }
      else {
        poVar5 = this->s;
        Color::operator<<(poVar5,Yellow);
        pcVar8 = "Allowed to fail so marking it as not failed\n";
        lVar7 = 0x2c;
      }
    }
    else {
      poVar5 = this->s;
      Color::operator<<(poVar5,Yellow);
      pcVar8 = "Failed as expected so marking it as not failed\n";
      lVar7 = 0x2f;
    }
  }
  else {
    poVar5 = this->s;
    Color::operator<<(poVar5,Red);
    pcVar8 = "Should have failed but didn\'t! Marking it as failed!\n";
    lVar7 = 0x35;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar8,lVar7);
LAB_001148ba:
  if ((st->failure_flags & 8) != 0) {
    poVar5 = this->s;
    Color::operator<<(poVar5,Red);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"Aborting - too many failed asserts!\n",0x24);
  }
  Color::operator<<(this->s,None);
  return;
}

Assistant:

void test_case_end(const CurrentTestCaseStats& st) override {
            if(tc->m_no_output)
                return;

            // log the preamble of the test case only if there is something
            // else to print - something other than that an assert has failed
            if(opt.duration ||
               (st.failure_flags && st.failure_flags != TestCaseFailureReason::AssertFailure))
                logTestStart();

            if(opt.duration)
                s << Color::None << std::setprecision(6) << std::fixed << st.seconds
                  << " s: " << tc->m_name << "\n";

            if(st.failure_flags & TestCaseFailureReason::Timeout)
                s << Color::Red << "Test case exceeded time limit of " << std::setprecision(6)
                  << std::fixed << tc->m_timeout << "!\n";

            if(st.failure_flags & TestCaseFailureReason::ShouldHaveFailedButDidnt) {
                s << Color::Red << "Should have failed but didn't! Marking it as failed!\n";
            } else if(st.failure_flags & TestCaseFailureReason::ShouldHaveFailedAndDid) {
                s << Color::Yellow << "Failed as expected so marking it as not failed\n";
            } else if(st.failure_flags & TestCaseFailureReason::CouldHaveFailedAndDid) {
                s << Color::Yellow << "Allowed to fail so marking it as not failed\n";
            } else if(st.failure_flags & TestCaseFailureReason::DidntFailExactlyNumTimes) {
                s << Color::Red << "Didn't fail exactly " << tc->m_expected_failures
                  << " times so marking it as failed!\n";
            } else if(st.failure_flags & TestCaseFailureReason::FailedExactlyNumTimes) {
                s << Color::Yellow << "Failed exactly " << tc->m_expected_failures
                  << " times as expected so marking it as not failed!\n";
            }
            if(st.failure_flags & TestCaseFailureReason::TooManyFailedAsserts) {
                s << Color::Red << "Aborting - too many failed asserts!\n";
            }
            s << Color::None; // lgtm [cpp/useless-expression]
        }